

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O0

void * blowfish_ctx_alloc(void)

{
  mbedtls_blowfish_context *ctx;
  
  ctx = (mbedtls_blowfish_context *)calloc(1,0x1048);
  if (ctx == (mbedtls_blowfish_context *)0x0) {
    ctx = (mbedtls_blowfish_context *)0x0;
  }
  else {
    mbedtls_blowfish_init(ctx);
  }
  return ctx;
}

Assistant:

static void * blowfish_ctx_alloc( void )
{
    mbedtls_blowfish_context *ctx;
    ctx = mbedtls_calloc( 1, sizeof( mbedtls_blowfish_context ) );

    if( ctx == NULL )
        return( NULL );

    mbedtls_blowfish_init( ctx );

    return( ctx );
}